

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederateState helicsFederateGetState(HelicsFederate fed,HelicsError *err)

{
  HelicsFederateState HVar1;
  Federate *pFVar2;
  
  pFVar2 = getFed(fed,err);
  if (pFVar2 == (Federate *)0x0) {
    HVar1 = HELICS_STATE_UNKNOWN;
  }
  else {
    HVar1 = (HelicsFederateState)(char)(pFVar2->currentMode)._M_i;
  }
  return HVar1;
}

Assistant:

HelicsFederateState helicsFederateGetState(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_STATE_UNKNOWN;
    }

    auto fedMode = fedObj->getCurrentMode();
    return stateConversion(fedMode);
}